

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O2

wchar_t history_def_add(void *p,HistEventW *ev,wchar_t *str)

{
  void *pvVar1;
  wchar_t *pwVar2;
  wchar_t wVar3;
  size_t sVar4;
  size_t sVar5;
  void *__dest;
  
  pvVar1 = *(void **)((long)p + 0x28);
  if (pvVar1 != p) {
    pwVar2 = *(wchar_t **)((long)pvVar1 + 8);
    sVar4 = wcslen(pwVar2);
    sVar5 = wcslen(str);
    __dest = malloc((sVar5 + sVar4) * 4 + 4);
    if (__dest == (void *)0x0) {
      ev->num = L'\x02';
      ev->str = anon_var_dwarf_6d3c;
      wVar3 = L'\xffffffff';
    }
    else {
      memcpy(__dest,pwVar2,sVar4 * 4);
      memcpy((void *)(sVar4 * 4 + (long)__dest),str,sVar5 << 2);
      *(undefined4 *)((long)__dest + (sVar5 + sVar4) * 4) = 0;
      free(pwVar2);
      *(void **)((long)pvVar1 + 8) = __dest;
      pwVar2 = (wchar_t *)(*(undefined8 **)((long)p + 0x28))[1];
      *(undefined8 *)ev = **(undefined8 **)((long)p + 0x28);
      ev->str = pwVar2;
      wVar3 = L'\0';
    }
    return wVar3;
  }
  wVar3 = history_def_enter(p,ev,str);
  return wVar3;
}

Assistant:

static int
history_def_add(void *p, TYPE(HistEvent) *ev, const Char *str)
{
	history_t *h = (history_t *) p;
	size_t len, elen, slen;
	Char *s;
	HistEventPrivate *evp = (void *)&h->cursor->ev;

	if (h->cursor == &h->list)
		return history_def_enter(p, ev, str);
	elen = Strlen(evp->str);
	slen = Strlen(str);
	len = elen + slen + 1;
	s = h_malloc(len * sizeof(*s));
	if (s == NULL) {
		he_seterrev(ev, _HE_MALLOC_FAILED);
		return -1;
	}
	memcpy(s, evp->str, elen * sizeof(*s));
	memcpy(s + elen, str, slen * sizeof(*s)); 
        s[len - 1] = '\0';
	h_free(evp->str);
	evp->str = s;
	*ev = h->cursor->ev;
	return 0;
}